

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int xmlDelEncodingAlias(char *alias)

{
  int iVar1;
  int local_1c;
  int i;
  char *alias_local;
  
  if ((alias != (char *)0x0) && (xmlCharEncodingAliases != (xmlCharEncodingAliasPtr)0x0)) {
    for (local_1c = 0; local_1c < xmlCharEncodingAliasesNb; local_1c = local_1c + 1) {
      iVar1 = strcmp(xmlCharEncodingAliases[local_1c].alias,alias);
      if (iVar1 == 0) {
        (*xmlFree)(xmlCharEncodingAliases[local_1c].name);
        (*xmlFree)(xmlCharEncodingAliases[local_1c].alias);
        xmlCharEncodingAliasesNb = xmlCharEncodingAliasesNb + -1;
        memmove(xmlCharEncodingAliases + local_1c,xmlCharEncodingAliases + (local_1c + 1),
                (long)(xmlCharEncodingAliasesNb - local_1c) << 4);
        return 0;
      }
    }
  }
  return -1;
}

Assistant:

int
xmlDelEncodingAlias(const char *alias) {
    int i;

    if (alias == NULL)
	return(-1);

    if (xmlCharEncodingAliases == NULL)
	return(-1);
    /*
     * Walk down the list looking for a definition of the alias
     */
    for (i = 0;i < xmlCharEncodingAliasesNb;i++) {
	if (!strcmp(xmlCharEncodingAliases[i].alias, alias)) {
	    xmlFree((char *) xmlCharEncodingAliases[i].name);
	    xmlFree((char *) xmlCharEncodingAliases[i].alias);
	    xmlCharEncodingAliasesNb--;
	    memmove(&xmlCharEncodingAliases[i], &xmlCharEncodingAliases[i + 1],
		    sizeof(xmlCharEncodingAlias) * (xmlCharEncodingAliasesNb - i));
	    return(0);
	}
    }
    return(-1);
}